

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualRow.cpp
# Opt level: O2

void __thiscall HDualRow::choose_possible(HDualRow *this)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer ppVar7;
  double *pdVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  iVar11 = this->workModel->countUpdate;
  if (iVar11 < 10) {
    dVar14 = 1e-09;
  }
  else {
    dVar14 = *(double *)(&DAT_001549e0 + (ulong)(iVar11 < 0x14) * 8);
  }
  piVar4 = this->workMove;
  dVar1 = this->workModel->dblOption[2];
  this->workTheta = 1e+200;
  this->workCount = 0;
  piVar5 = (this->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (this->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppVar7 = (this->workData).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pdVar8 = this->workDual;
  uVar12 = 0;
  uVar9 = (ulong)(uint)this->packCount;
  if (this->packCount < 1) {
    uVar9 = uVar12;
  }
  dVar15 = 1e+200;
  uVar13 = -(ulong)(this->workDelta < 0.0);
  iVar11 = 0;
  for (; uVar9 != uVar12; uVar12 = uVar12 + 1) {
    iVar2 = piVar5[uVar12];
    dVar16 = pdVar6[uVar12];
    iVar3 = piVar4[iVar2];
    dVar16 = (double)(~uVar13 & (ulong)dVar16 | (ulong)-dVar16 & uVar13) * (double)iVar3;
    if (dVar14 < dVar16) {
      iVar10 = iVar11 + 1;
      this->workCount = iVar10;
      ppVar7[iVar11].first = iVar2;
      ppVar7[iVar11].second = dVar16;
      dVar17 = (double)iVar3 * pdVar8[iVar2] + dVar1;
      iVar11 = iVar10;
      if (dVar17 < dVar16 * dVar15) {
        dVar15 = dVar17 / dVar16;
        this->workTheta = dVar15;
      }
    }
  }
  return;
}

Assistant:

void HDualRow::choose_possible() {
    /**
     * Will determine the possible variables
     * Can be parallel.
     */
    const double Ta = workModel->countUpdate < 10 ? 1e-9 :
                      workModel->countUpdate < 20 ? 3e-8 : 1e-6;
    const double Td = workModel->dblOption[DBLOPT_DUAL_TOL];
    const int sourceOut = workDelta < 0 ? -1 : 1;
    workTheta = HSOL_CONST_INF;
    workCount = 0;
    for (int i = 0; i < packCount; i++) {
        const int iCol = packIndex[i];
        const int move = workMove[iCol];
        const double alpha = packValue[i] * sourceOut * move;
        if (alpha > Ta) {
            workData[workCount++] = make_pair(iCol, alpha);
            const double relax = workDual[iCol] * move + Td;
            if (workTheta * alpha > relax)
                workTheta = relax / alpha;
        }
    }

}